

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

void obx::anon_unknown_3::cCallbackTrampolineAsyncTreePut(obx_err status,obx_id id,void *userData)

{
  type this;
  undefined1 local_88 [8];
  AsyncTreePutResult result;
  string local_48 [8];
  string errorMessage;
  unique_ptr<std::function<void_(const_obx::AsyncTreePutResult_&)>,_std::default_delete<std::function<void_(const_obx::AsyncTreePutResult_&)>_>_>
  local_28;
  unique_ptr<std::function<void_(const_obx::AsyncTreePutResult_&)>,_std::default_delete<std::function<void_(const_obx::AsyncTreePutResult_&)>_>_>
  callback;
  void *userData_local;
  obx_id id_local;
  obx_err status_local;
  
  callback._M_t.
  super___uniq_ptr_impl<std::function<void_(const_obx::AsyncTreePutResult_&)>,_std::default_delete<std::function<void_(const_obx::AsyncTreePutResult_&)>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::function<void_(const_obx::AsyncTreePutResult_&)>_*,_std::default_delete<std::function<void_(const_obx::AsyncTreePutResult_&)>_>_>
  .super__Head_base<0UL,_std::function<void_(const_obx::AsyncTreePutResult_&)>_*,_false>.
  _M_head_impl = (__uniq_ptr_data<std::function<void_(const_obx::AsyncTreePutResult_&)>,_std::default_delete<std::function<void_(const_obx::AsyncTreePutResult_&)>_>,_true,_true>
                  )(__uniq_ptr_data<std::function<void_(const_obx::AsyncTreePutResult_&)>,_std::default_delete<std::function<void_(const_obx::AsyncTreePutResult_&)>_>,_true,_true>
                    )userData;
  if (userData != (void *)0x0) {
    std::
    unique_ptr<std::function<void(obx::AsyncTreePutResult_const&)>,std::default_delete<std::function<void(obx::AsyncTreePutResult_const&)>>>
    ::unique_ptr<std::default_delete<std::function<void(obx::AsyncTreePutResult_const&)>>,void>
              ((unique_ptr<std::function<void(obx::AsyncTreePutResult_const&)>,std::default_delete<std::function<void(obx::AsyncTreePutResult_const&)>>>
                *)&local_28,(pointer)userData);
    std::__cxx11::string::string(local_48);
    if (status != 0) {
      internal::appendLastErrorText(status,(string *)local_48);
    }
    local_88._0_4_ = internal::mapErrorToTreePutResult(status);
    local_88._4_4_ = status;
    result._0_8_ = id;
    std::__cxx11::string::string((string *)&result.id,local_48);
    this = std::
           unique_ptr<std::function<void_(const_obx::AsyncTreePutResult_&)>,_std::default_delete<std::function<void_(const_obx::AsyncTreePutResult_&)>_>_>
           ::operator*(&local_28);
    std::function<void_(const_obx::AsyncTreePutResult_&)>::operator()
              (this,(AsyncTreePutResult *)local_88);
    AsyncTreePutResult::~AsyncTreePutResult((AsyncTreePutResult *)local_88);
    std::__cxx11::string::~string(local_48);
    std::
    unique_ptr<std::function<void_(const_obx::AsyncTreePutResult_&)>,_std::default_delete<std::function<void_(const_obx::AsyncTreePutResult_&)>_>_>
    ::~unique_ptr(&local_28);
    return;
  }
  __assert_fail("userData",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/objectbox[P]objectbox-ts-demo/build_O0/_deps/objectbox-download-src/include/objectbox.hpp"
                ,0xd62,
                "void obx::(anonymous namespace)::cCallbackTrampolineAsyncTreePut(obx_err, obx_id, void *)"
               );
}

Assistant:

void cCallbackTrampolineAsyncTreePut(obx_err status, obx_id id, void* userData) {
    assert(userData);
    std::unique_ptr<AsyncTreePutCallback> callback(static_cast<AsyncTreePutCallback*>(userData));
    std::string errorMessage;
    if (status != OBX_SUCCESS) internal::appendLastErrorText(status, errorMessage);
    AsyncTreePutResult result{internal::mapErrorToTreePutResult(status), status, id, std::move(errorMessage)};
    (*callback)(result);
}